

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_1adff5::IntegerExpr::printLeft(IntegerExpr *this,OutputStream *S)

{
  size_t *psVar1;
  char *pcVar2;
  char *pcVar3;
  size_t Size;
  ulong N;
  size_t N_00;
  size_t N_01;
  
  if (3 < (ulong)((long)(this->Type).Last - (long)(this->Type).First)) {
    OutputStream::grow(S,1);
    S->Buffer[S->CurrentPosition] = '(';
    S->CurrentPosition = S->CurrentPosition + 1;
    pcVar3 = (this->Type).First;
    N_00 = (long)(this->Type).Last - (long)pcVar3;
    if (N_00 != 0) {
      OutputStream::grow(S,N_00);
      memmove(S->Buffer + S->CurrentPosition,pcVar3,N_00);
      S->CurrentPosition = S->CurrentPosition + N_00;
    }
    OutputStream::grow(S,1);
    S->Buffer[S->CurrentPosition] = ')';
    S->CurrentPosition = S->CurrentPosition + 1;
  }
  pcVar3 = (this->Value).First;
  if (*pcVar3 == 'n') {
    OutputStream::grow(S,1);
    S->Buffer[S->CurrentPosition] = '-';
    S->CurrentPosition = S->CurrentPosition + 1;
    pcVar3 = (this->Value).First;
    pcVar2 = (this->Value).Last;
    pcVar3 = pcVar3 + (pcVar2 != pcVar3);
    N_01 = (long)pcVar2 - (long)pcVar3;
    if (N_01 == 0) goto LAB_0015659a;
    OutputStream::grow(S,N_01);
    pcVar2 = S->Buffer;
  }
  else {
    N_01 = (long)(this->Value).Last - (long)pcVar3;
    if (N_01 == 0) goto LAB_0015659a;
    OutputStream::grow(S,N_01);
    pcVar2 = S->Buffer;
  }
  psVar1 = &S->CurrentPosition;
  memmove(pcVar2 + *psVar1,pcVar3,N_01);
  *psVar1 = *psVar1 + N_01;
LAB_0015659a:
  pcVar3 = (this->Type).First;
  N = (long)(this->Type).Last - (long)pcVar3;
  if (N < 4 && N != 0) {
    OutputStream::grow(S,N);
    memmove(S->Buffer + S->CurrentPosition,pcVar3,N);
    S->CurrentPosition = S->CurrentPosition + N;
  }
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    if (Type.size() > 3) {
      S += "(";
      S += Type;
      S += ")";
    }

    if (Value[0] == 'n') {
      S += "-";
      S += Value.dropFront(1);
    } else
      S += Value;

    if (Type.size() <= 3)
      S += Type;
  }